

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::SetVertexNormal(ON_Mesh *this,int vertex_index,ON_3dVector *normal)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ON_3fVector *pOVar4;
  undefined1 auStack_50 [4];
  int normal_count;
  ON_3fVector v;
  bool bUnitVector;
  ON_3dVector unit_vector;
  bool rc;
  ON_3dVector *normal_local;
  int vertex_index_local;
  ON_Mesh *this_local;
  
  unit_vector.z._7_1_ = false;
  unique0x00012000 = normal->x;
  dVar1 = normal->y;
  dVar2 = normal->z;
  v.y._3_1_ = ON_3dVector::Unitize((ON_3dVector *)&v.z);
  ON_3fVector::ON_3fVector
            ((ON_3fVector *)auStack_50,(float)stack0xffffffffffffffc0,(float)dVar1,(float)dVar2);
  iVar3 = ON_SimpleArray<ON_3fVector>::Count(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
  if (-1 < vertex_index) {
    if (vertex_index < iVar3) {
      pOVar4 = ON_SimpleArray<ON_3fVector>::operator[]
                         (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,vertex_index);
      pOVar4->x = (float)auStack_50;
      pOVar4->y = (float)normal_count;
      pOVar4->z = v.x;
      unit_vector.z._7_1_ = (bool)(v.y._3_1_ & 1);
    }
    else if (vertex_index == iVar3) {
      ON_SimpleArray<ON_3fVector>::Append
                (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)auStack_50);
      unit_vector.z._7_1_ = (bool)(v.y._3_1_ & 1);
    }
  }
  return unit_vector.z._7_1_;
}

Assistant:

bool ON_Mesh::SetVertexNormal(
       int vertex_index,
       const ON_3dVector& normal
       )
{
  bool rc = false;
  // use double precision for unitizing normal
  ON_3dVector unit_vector = normal;
  const bool bUnitVector = unit_vector.Unitize();
  ON_3fVector v((float)unit_vector.x, (float)unit_vector.y, (float)unit_vector.z);
  int normal_count = m_N.Count();
  if ( vertex_index >= 0 ) {
    if ( vertex_index < normal_count ) {
      m_N[vertex_index] = v;
      rc = bUnitVector;
    }
    else if ( vertex_index == normal_count ) {
      m_N.Append(v);
      rc = bUnitVector;
    }
  }
  return rc;
}